

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectation
          (ScriptValidator *this,Location *loc,TypeVector *result_types,ConstVector *expected,
          char *desc)

{
  bool bVar1;
  reference __src;
  Type local_b8;
  undefined1 local_b0 [8];
  Const ex;
  const_iterator __end2;
  const_iterator __begin2;
  ConstVector *__range2;
  TypeVector actual_types;
  char *desc_local;
  ConstVector *expected_local;
  TypeVector *result_types_local;
  Location *loc_local;
  ScriptValidator *this_local;
  
  actual_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)desc;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&__range2);
  __end2 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::begin(expected);
  ex.nan_._8_8_ = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::end(expected);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wabt::Const_*,_std::vector<wabt::Const,_std::allocator<wabt::Const>_>_>
                                *)(ex.nan_ + 2));
    if (!bVar1) break;
    __src = __gnu_cxx::
            __normal_iterator<const_wabt::Const_*,_std::vector<wabt::Const,_std::allocator<wabt::Const>_>_>
            ::operator*(&__end2);
    memcpy(local_b0,__src,0x50);
    local_b8 = Const::type((Const *)local_b0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&__range2,&local_b8);
    __gnu_cxx::
    __normal_iterator<const_wabt::Const_*,_std::vector<wabt::Const,_std::allocator<wabt::Const>_>_>
    ::operator++(&__end2);
  }
  CheckResultTypes(this,loc,(TypeVector *)&__range2,result_types,
                   (char *)actual_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&__range2);
  return;
}

Assistant:

void ScriptValidator::CheckExpectation(const Location* loc,
                                       const TypeVector& result_types,
                                       const ConstVector& expected,
                                       const char* desc) {
  // Here we take the concrete expected output types verify those actains
  // the types that are the result of the action.
  TypeVector actual_types;
  for (auto ex : expected) {
    actual_types.push_back(ex.type());
  }
  CheckResultTypes(loc, actual_types, result_types, desc);
}